

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfuturewatcher.cpp
# Opt level: O0

void __thiscall
QFutureWatcherBasePrivate::sendCallOutEvent
          (QFutureWatcherBasePrivate *this,QFutureCallOutEvent *event)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QFutureInterfaceBase *this_00;
  QFutureWatcherBase *this_01;
  long in_RSI;
  QFutureWatcherBasePrivate *in_RDI;
  int i;
  int endIndex;
  int beginIndex;
  QFutureWatcherBase *q;
  int local_24;
  undefined4 in_stack_ffffffffffffffe4;
  undefined1 enable;
  
  enable = (undefined1)((uint)in_stack_ffffffffffffffe4 >> 0x18);
  this_00 = (QFutureInterfaceBase *)q_func(in_RDI);
  this_01 = (QFutureWatcherBase *)(ulong)*(uint *)(in_RSI + 0x10);
  iVar2 = (int)((ulong)in_RDI >> 0x20);
  switch(this_01) {
  case (QFutureWatcherBase *)0x0:
    QFutureWatcherBase::started((QFutureWatcherBase *)0x6e6c9c);
    break;
  case (QFutureWatcherBase *)0x1:
    QFutureWatcherBase::finished((QFutureWatcherBase *)0x6e6cab);
    break;
  case (QFutureWatcherBase *)0x2:
    QBasicAtomicInteger<int>::storeRelaxed((QBasicAtomicInteger<int> *)this_01,iVar2);
    QFutureWatcherBase::canceled((QFutureWatcherBase *)0x6e6ccc);
    break;
  case (QFutureWatcherBase *)0x3:
    (*((QObject *)&this_00->_vptr_QFutureInterfaceBase)->_vptr_QObject[0xd])();
    bVar1 = QFutureInterfaceBase::isCanceled((QFutureInterfaceBase *)0x6e6ce4);
    if (!bVar1) {
      QFutureWatcherBase::suspending((QFutureWatcherBase *)0x6e6cf9);
      QFutureWatcherBase::paused((QFutureWatcherBase *)0x6e6d03);
    }
    break;
  case (QFutureWatcherBase *)0x4:
    (*((QObject *)&this_00->_vptr_QFutureInterfaceBase)->_vptr_QObject[0xd])();
    bVar1 = QFutureInterfaceBase::isCanceled((QFutureInterfaceBase *)0x6e6d1b);
    if (!bVar1) {
      QFutureWatcherBase::suspended((QFutureWatcherBase *)0x6e6d30);
    }
    break;
  case (QFutureWatcherBase *)0x5:
    (*((QObject *)&this_00->_vptr_QFutureInterfaceBase)->_vptr_QObject[0xd])();
    bVar1 = QFutureInterfaceBase::isCanceled((QFutureInterfaceBase *)0x6e6d48);
    if (!bVar1) {
      QFutureWatcherBase::resumed((QFutureWatcherBase *)0x6e6d5d);
    }
    break;
  case (QFutureWatcherBase *)0x6:
    (*((QObject *)&this_00->_vptr_QFutureInterfaceBase)->_vptr_QObject[0xd])();
    bVar1 = QFutureInterfaceBase::isCanceled((QFutureInterfaceBase *)0x6e6e3c);
    if (!bVar1) {
      QFutureWatcherBase::progressValueChanged
                ((QFutureWatcherBase *)0x6e6e56,(int)((ulong)in_RDI >> 0x20));
      bVar1 = QString::isNull((QString *)0x6e6e64);
      if (!bVar1) {
        QFutureWatcherBase::progressTextChanged(this_01,(QString *)in_RDI);
      }
    }
    break;
  case (QFutureWatcherBase *)0x7:
    QFutureWatcherBase::progressRangeChanged((QFutureWatcherBase *)0x6e6e97,iVar2,(int)in_RDI);
    break;
  case (QFutureWatcherBase *)0x8:
    (*((QObject *)&this_00->_vptr_QFutureInterfaceBase)->_vptr_QObject[0xd])();
    bVar1 = QFutureInterfaceBase::isCanceled((QFutureInterfaceBase *)0x6e6d75);
    if (!bVar1) {
      iVar2 = QBasicAtomicInteger<int>::fetchAndAddRelaxed
                        ((QBasicAtomicInteger<int> *)this_01,(int)((ulong)in_RDI >> 0x20));
      if (iVar2 <= in_RDI->maximumPendingResultsReady) {
        (*((QObject *)&this_00->_vptr_QFutureInterfaceBase)->_vptr_QObject[0xd])();
        QFutureInterfaceBase::setThrottled(this_00,(bool)enable);
      }
      local_24 = *(int *)(in_RSI + 0x14);
      iVar2 = *(int *)(in_RSI + 0x18);
      QFutureWatcherBase::resultsReadyAt
                ((QFutureWatcherBase *)0x6e6de0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      iVar3 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x6e6df0);
      if (0 < iVar3) {
        for (; local_24 < iVar2; local_24 = local_24 + 1) {
          QFutureWatcherBase::resultReadyAt
                    ((QFutureWatcherBase *)0x6e6e1a,(int)((ulong)in_RDI >> 0x20));
        }
      }
    }
  }
  return;
}

Assistant:

void QFutureWatcherBasePrivate::sendCallOutEvent(QFutureCallOutEvent *event)
{
    Q_Q(QFutureWatcherBase);

    switch (event->callOutType) {
        case QFutureCallOutEvent::Started:
            emit q->started();
        break;
        case QFutureCallOutEvent::Finished:
            emit q->finished();
        break;
        case QFutureCallOutEvent::Canceled:
            pendingResultsReady.storeRelaxed(0);
            emit q->canceled();
        break;
        case QFutureCallOutEvent::Suspending:
            if (q->futureInterface().isCanceled())
                break;
            emit q->suspending();
#if QT_DEPRECATED_SINCE(6, 0)
QT_WARNING_PUSH
QT_WARNING_DISABLE_DEPRECATED
            emit q->paused();
QT_WARNING_POP
#endif
        break;
        case QFutureCallOutEvent::Suspended:
            if (q->futureInterface().isCanceled())
                break;
            emit q->suspended();
        break;
        case QFutureCallOutEvent::Resumed:
            if (q->futureInterface().isCanceled())
                break;
            emit q->resumed();
        break;
        case QFutureCallOutEvent::ResultsReady: {
            if (q->futureInterface().isCanceled())
                break;

            if (pendingResultsReady.fetchAndAddRelaxed(-1) <= maximumPendingResultsReady)
                q->futureInterface().setThrottled(false);

            const int beginIndex = event->index1;
            const int endIndex = event->index2;

            emit q->resultsReadyAt(beginIndex, endIndex);

            if (resultAtConnected.loadRelaxed() <= 0)
                break;

            for (int i = beginIndex; i < endIndex; ++i)
                emit q->resultReadyAt(i);

        } break;
        case QFutureCallOutEvent::Progress:
            if (q->futureInterface().isCanceled())
                break;

            emit q->progressValueChanged(event->index1);
            if (!event->text.isNull()) // ###
                emit q->progressTextChanged(event->text);
        break;
        case QFutureCallOutEvent::ProgressRange:
            emit q->progressRangeChanged(event->index1, event->index2);
        break;
        default: break;
    }
}